

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O0

int Imf_3_3::anon_unknown_12::calculateNumYLevels
              (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY)

{
  int iVar1;
  ArgExc *this;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int h_1;
  int h;
  int w;
  int num;
  char *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  iVar1 = *(int *)(in_RDI + 8);
  if (iVar1 == 0) {
    local_1c = 1;
  }
  else if (iVar1 == 1) {
    local_20 = (in_EDX - in_ESI) + 1;
    local_24 = (in_R8D - in_ECX) + 1;
    std::max<int>(&local_20,&local_24);
    local_1c = roundLog2((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                         (LevelRoundingMode)in_stack_ffffffffffffffc0);
    local_1c = local_1c + 1;
  }
  else {
    if (iVar1 != 2) {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(this,in_stack_ffffffffffffffb8);
      __cxa_throw(this,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    local_1c = roundLog2((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                         (LevelRoundingMode)in_stack_ffffffffffffffc0);
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int
calculateNumYLevels (
    const TileDescription& tileDesc, int minX, int maxX, int minY, int maxY)
{
    int num = 0;

    switch (tileDesc.mode)
    {
        case ONE_LEVEL: num = 1; break;

        case MIPMAP_LEVELS:

        {
            int w = maxX - minX + 1;
            int h = maxY - minY + 1;
            num   = roundLog2 (std::max (w, h), tileDesc.roundingMode) + 1;
        }
        break;

        case RIPMAP_LEVELS:

        {
            int h = maxY - minY + 1;
            num   = roundLog2 (h, tileDesc.roundingMode) + 1;
        }
        break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    return num;
}